

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> __thiscall
capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *this,Client *client)

{
  PromiseArenaMember *node;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_31;
  PromiseArenaMember *local_30;
  undefined8 local_28;
  code *local_20;
  
  capnp::_::CapabilityServerSetBase::getLocalServerInternal
            ((CapabilityServerSetBase *)&local_30,(Client *)client);
  local_20 = kj::_::
             SimpleTransformPromiseNode<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1311:13)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<void*,capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_>,kj::_::PromiseDisposer,capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_,void*&>
            ((PromiseDisposer *)&local_28,(OwnPromiseNode *)&local_30,&local_31,&local_20);
  node = local_30;
  *(undefined8 *)this = local_28;
  if (local_30 != (PromiseArenaMember *)0x0) {
    local_30 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<typename T::Server&>> CapabilityServerSet<T>::getLocalServer(
    typename T::Client& client) {
  return getLocalServerInternal(client)
      .then([](void* server) -> kj::Maybe<typename T::Server&> {
    if (server == nullptr) {
      return kj::none;
    } else {
      return *reinterpret_cast<typename T::Server*>(server);
    }
  });
}